

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O1

void * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::
reallocate(MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void> *this
          ,void *ptr,size_type newUserSize)

{
  SmallMemChunk *chunk;
  bool bVar1;
  SmallMemChunk *pSVar2;
  SmallMemChunk *pSVar3;
  SmallMemChunk *curr;
  ulong uVar4;
  void *pvVar5;
  undefined4 *puVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (ptr == (void *)0x0) {
    pvVar5 = allocate(this,newUserSize);
    return pvVar5;
  }
  uVar4 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffff0;
  uVar10 = uVar4;
  if ((*(ulong *)((long)ptr + -8) & 2) != 0) {
    lVar9 = (long)*(char *)((long)ptr + (uVar4 - 0x11));
    if (lVar9 < 1) {
      puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
      *puVar6 = 3;
      *(char **)(puVar6 + 2) = "Invalid padding byte value";
      __cxa_throw(puVar6,&Exception::typeinfo,0);
    }
    uVar10 = uVar4 - lVar9;
  }
  uVar11 = 0x20;
  if (0xf < newUserSize) {
    uVar11 = newUserSize + 0x1f & 0xfffffffffffffff0;
  }
  if ((uVar10 + 0xf & 0xfffffffffffffff0) < uVar11) {
    pvVar5 = allocate(this,newUserSize);
    if (pvVar5 != (void *)0x0) {
      memcpy(pvVar5,ptr,uVar10 - 0x10);
      deallocate(this,ptr,0);
    }
  }
  else {
    uVar10 = uVar4 - uVar11;
    if (0x1f < uVar10) {
      chunk = (SmallMemChunk *)((long)ptr + (uVar11 - 0x10));
      *(ulong *)((long)ptr + -8) = uVar11;
      *(ulong *)((long)ptr + (uVar11 - 0x10)) = uVar11;
      *(ulong *)((long)ptr + (uVar11 - 8)) = uVar10;
      *(ulong *)((long)ptr + (uVar4 - 0x10)) = uVar10;
      if (uVar10 < 0x100) {
        pSVar2 = *(SmallMemChunk **)((long)this + uVar10 + 0x30);
        uVar10 = uVar10 >> 3;
        if (pSVar2 == (SmallMemChunk *)0x0) {
          chunk->next = chunk;
          chunk->prev = chunk;
          this->m_smallLists[uVar10].m_head = chunk;
        }
        else {
          pSVar3 = pSVar2->next;
          pSVar2->next = chunk;
          pSVar3->prev = chunk;
          chunk->next = pSVar3;
          chunk->prev = pSVar2;
        }
        if ((this->m_smallMap >> ((uint)uVar10 & 0x1f) & 1) == 0) {
          this->m_smallMap = this->m_smallMap | 1 << ((byte)uVar10 & 0x1f);
        }
      }
      else {
        addLargeChunk(this,(MemChunk *)chunk);
      }
    }
    bVar1 = this->m_storingExactSize;
    uVar10 = *(ulong *)((long)ptr + -8);
    uVar4 = uVar10 & 0xfffffffffffffff0;
    *(ulong *)((long)ptr + -8) = uVar10 | 1;
    if ((bVar1 == true) && (uVar4 != newUserSize + 0x10)) {
      *(ulong *)((long)ptr + -8) = uVar10 | 3;
      *(byte *)((long)ptr + (uVar4 - 0x11)) = ((byte)uVar10 & 0xf0) - (char)(newUserSize + 0x10);
    }
    *(ulong *)((long)ptr + (uVar4 - 0x10)) = uVar4 | 1;
    pvVar5 = ptr;
    if ((this->m_padding == true) &&
       (bVar7 = (((byte)*(undefined4 *)((long)ptr + -8) & 0xf0) - (char)newUserSize) - 0x11,
       '\0' < (char)bVar7)) {
      uVar8 = 8;
      if ((char)bVar7 < '\b') {
        uVar8 = (uint)bVar7;
      }
      uVar10 = 1;
      if ('\x01' < (char)uVar8) {
        uVar10 = (ulong)uVar8;
      }
      uVar4 = 0;
      do {
        *(char *)((long)ptr + uVar4 + newUserSize) = this->m_paddingByte;
        uVar4 = uVar4 + 1;
      } while (uVar10 != uVar4);
    }
  }
  return pvVar5;
}

Assistant:

T*
    reallocate (T* ptr, size_type newUserSize)
    {
        if (ptr == nullptr)
        {
            return allocate(newUserSize);
        }

        MemChunk* chunk = mem2Chunk (ptr);
        size_type oldAllocSize = chunk->getUserSize ();
        size_type oldChunkSize = calcChunkSize(oldAllocSize);

        size_type newAllocSize = newUserSize;
        size_type newChunkSize = (newAllocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize(newAllocSize);

        if (oldChunkSize < newChunkSize)
        {
            // For now we use a simple algorithm that allocate new memory.
            T* newPtr = allocate (newUserSize);
            if (newPtr)
            {
                memcpy(newPtr, ptr, oldAllocSize);
                deallocate (ptr);
            }
            return newPtr;
        }
        else
        {
            m_logger.logReallocation(ptr, oldAllocSize, newUserSize);

            // simply split the chunk
            splitChunk (chunk, newChunkSize);
            setUsed (chunk, newUserSize);
            return ptr;
        }
    }